

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_timer.hpp
# Opt level: O2

void __thiscall pico_tree::scoped_timer::~scoped_timer(scoped_timer *this)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  double dVar4;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar1 = (this->start_).__d.__r;
  poVar3 = std::operator<<((ostream *)&std::cout,"[");
  poVar3 = std::operator<<(poVar3,(string *)this);
  std::operator<<(poVar3,"] Elapsed time: ");
  dVar4 = (double)(lVar2 - lVar1) / 1000000000.0;
  poVar3 = std::ostream::_M_insert<double>(dVar4 * 1000.0);
  std::operator<<(poVar3," ms\n");
  if (1 < this->times_) {
    poVar3 = std::operator<<((ostream *)&std::cout,"[");
    poVar3 = std::operator<<(poVar3,(string *)this);
    std::operator<<(poVar3,"] Average time: ");
    poVar3 = std::ostream::_M_insert<double>
                       ((dVar4 / (((double)CONCAT44(0x45300000,(int)(this->times_ >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)this->times_) -
                                 4503599627370496.0))) * 1000.0);
    std::operator<<(poVar3," ms\n");
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~scoped_timer() {
    std::chrono::duration<double> elapsed_seconds =
        std::chrono::high_resolution_clock::now() - start_;
    std::cout << "[" << name_
              << "] Elapsed time: " << (elapsed_seconds.count() * 1000.0)
              << " ms\n";

    if (times_ > 1) {
      std::cout << "[" << name_ << "] Average time: "
                << ((elapsed_seconds.count() / static_cast<double>(times_)) *
                    1000.0)
                << " ms\n";
    }
  }